

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O1

void __thiscall clipp::parameter::parameter(parameter *this,match_predicate *filter)

{
  _Manager_type p_Var1;
  _Manager_type p_Var2;
  _Any_data local_68;
  undefined1 local_58 [16];
  _Any_data local_48;
  _Manager_type local_38;
  _Invoker_type local_30;
  
  (this->super_token<clipp::parameter>).doc_._M_dataplus._M_p =
       (pointer)&(this->super_token<clipp::parameter>).doc_.field_2;
  (this->super_token<clipp::parameter>).doc_._M_string_length = 0;
  (this->super_token<clipp::parameter>).doc_.field_2._M_local_buf[0] = '\0';
  (this->super_token<clipp::parameter>).repeatable_ = false;
  (this->super_token<clipp::parameter>).blocking_ = false;
  (this->super_action_provider<clipp::parameter>).argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_action_provider<clipp::parameter>).argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_action_provider<clipp::parameter>).argActions_.
  super__Vector_base<std::function<void_(const_char_*)>,_std::allocator<std::function<void_(const_char_*)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_action_provider<clipp::parameter>).repeatActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_action_provider<clipp::parameter>).repeatActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_action_provider<clipp::parameter>).repeatActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_action_provider<clipp::parameter>).missingActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_action_provider<clipp::parameter>).missingActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_action_provider<clipp::parameter>).missingActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_action_provider<clipp::parameter>).blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_action_provider<clipp::parameter>).blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_action_provider<clipp::parameter>).blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_action_provider<clipp::parameter>).conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_action_provider<clipp::parameter>).conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_action_provider<clipp::parameter>).conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->flags_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_action_provider<clipp::parameter>).blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_action_provider<clipp::parameter>).blockedActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_action_provider<clipp::parameter>).conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_action_provider<clipp::parameter>).conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_action_provider<clipp::parameter>).conflictActions_.
  super__Vector_base<std::function<void_(int)>,_std::allocator<std::function<void_(int)>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->flags_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->flags_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->flags_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48 = (_Any_data)(ZEXT416(0) << 0x40);
  local_30 = filter->_M_invoker;
  local_58._0_8_ = (_Manager_type)0x0;
  p_Var1 = (filter->super__Function_base)._M_manager;
  local_68 = local_48;
  p_Var2 = (_Manager_type)local_58._0_8_;
  if (p_Var1 != (_Manager_type)0x0) {
    local_68 = (filter->super__Function_base)._M_functor;
    *(_Any_data *)&(filter->super__Function_base)._M_manager = local_48;
    p_Var2 = p_Var1;
  }
  local_58._8_8_ = local_30;
  local_58._0_8_ = p_Var2;
  local_38 = (_Manager_type)0x0;
  if (p_Var2 != (_Manager_type)0x0) {
    local_48 = local_68;
    local_58 = ZEXT816(0) << 0x20;
    local_38 = p_Var2;
  }
  std::function<clipp::subrange(std::__cxx11::string_const&)>::
  function<clipp::parameter::predicate_adapter,void>
            ((function<clipp::subrange(std::__cxx11::string_const&)> *)&this->matcher_,
             (predicate_adapter *)&local_48);
  if (local_38 != (_Manager_type)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if ((code *)local_58._0_8_ != (code *)0x0) {
    (*(code *)local_58._0_8_)(&local_68,&local_68,3);
  }
  (this->label_)._M_dataplus._M_p = (pointer)&(this->label_).field_2;
  (this->label_)._M_string_length = 0;
  (this->label_).field_2._M_local_buf[0] = '\0';
  this->required_ = false;
  this->greedy_ = false;
  return;
}

Assistant:

explicit
    parameter(match_predicate filter):
        flags_{},
        matcher_{predicate_adapter{std::move(filter)}},
        label_{}, required_{false}, greedy_{false}
    {}